

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O2

void sat_solver_canceluntil(sat_solver *s,int level)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  
  uVar1 = (s->trail_lim).size;
  if ((int)uVar1 <= level) {
    return;
  }
  if (0 < (int)uVar1) {
    piVar4 = (s->trail_lim).ptr;
    iVar2 = piVar4[level];
    iVar3 = piVar4[(ulong)uVar1 - 1];
    for (lVar5 = (long)s->qtail; iVar2 < lVar5; lVar5 = lVar5 + -1) {
      iVar6 = s->trail[lVar5 + -1] >> 1;
      s->assigns[iVar6] = '\x03';
      s->reasons[iVar6] = 0;
      if (lVar5 <= iVar3) {
        s->polarity[iVar6] = ~*(byte *)(s->trail + lVar5 + -1) & 1;
      }
    }
    for (lVar5 = (long)s->qhead; iVar2 < lVar5; lVar5 = lVar5 + -1) {
      order_unassigned(s,s->trail[lVar5 + -1] >> 1);
    }
    s->qtail = iVar2;
    s->qhead = iVar2;
    veci_resize(&s->trail_lim,level);
    return;
  }
  __assert_fail("veci_size(&s->trail_lim) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                ,0x29c,"void sat_solver_canceluntil(sat_solver *, int)");
}

Assistant:

static void sat_solver_canceluntil(sat_solver* s, int level) {
    int      bound;
    int      lastLev;
    int      c;
    
    if (sat_solver_dl(s) <= level)
        return;

    assert( veci_size(&s->trail_lim) > 0 );
    bound   = (veci_begin(&s->trail_lim))[level];
    lastLev = (veci_begin(&s->trail_lim))[veci_size(&s->trail_lim)-1];

    ////////////////////////////////////////
    // added to cancel all assignments
//    if ( level == -1 )
//        bound = 0;
    ////////////////////////////////////////

    for (c = s->qtail-1; c >= bound; c--) {
        int     x  = lit_var(s->trail[c]);
        var_set_value(s, x, varX);
        s->reasons[x] = 0;
        if ( c < lastLev )
            var_set_polar( s, x, !lit_sign(s->trail[c]) );
    }
    //printf( "\n" );

    for (c = s->qhead-1; c >= bound; c--)
        order_unassigned(s,lit_var(s->trail[c]));

    s->qhead = s->qtail = bound;
    veci_resize(&s->trail_lim,level);
}